

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator::GenerateMembers
          (ImmutableMessageOneofFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  string_view end_varname;
  Printer *this_00;
  Options *pOVar3;
  undefined1 kdoc;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1d0;
  string_view local_1c8;
  string_view local_1b8;
  string_view local_1a8;
  FieldDescriptor local_198;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_140;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  string_view local_128;
  string_view local_118;
  Options local_108;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_b0;
  string_view local_a8;
  string_view local_98;
  string_view local_88 [2];
  Options local_68;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageOneofFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  PrintExtraFieldInfo(&(this->super_ImmutableMessageFieldGenerator).variables_,printer);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar3 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  java::Options::Options(&local_68,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,HAZZER,&local_68,false,false,false);
  java::Options::~Options(&local_68);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_88,
             "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableMessageFieldGenerator).variables_,local_88[0]);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"}");
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_b0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(pPVar2,local_98,local_a8,pFVar1,local_b0)
  ;
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar3 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  java::Options::Options(&local_108,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,GETTER,&local_108,false,false,false);
  java::Options::~Options(&local_108);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_118,
             "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  if ($has_oneof_case_message$) {\n     return ($type$) $oneof_name$_;\n  }\n  return $type$.getDefaultInstance();\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableMessageFieldGenerator).variables_,local_118);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"}");
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_140);
  end_varname._M_str = local_138._M_str;
  end_varname._M_len = local_138._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_128,end_varname,pFVar1,local_140);
  this_00 = local_18;
  kdoc = SUB81(local_138._M_str,0);
  pPVar2 = (Printer *)(this->super_ImmutableMessageFieldGenerator).descriptor_;
  pOVar3 = Context::options((this->super_ImmutableMessageFieldGenerator).context_);
  java::Options::Options((Options *)&local_198,pOVar3);
  WriteFieldDocComment((java *)this_00,pPVar2,&local_198,(Options *)0x0,(bool)kdoc);
  java::Options::~Options((Options *)&local_198);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a8,
             "@java.lang.Override\n$deprecation$public $type$OrBuilder ${$get$capitalized_name$OrBuilder$}$() {\n  if ($has_oneof_case_message$) {\n     return ($type$) $oneof_name$_;\n  }\n  return $type$.getDefaultInstance();\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableMessageFieldGenerator).variables_,local_1a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"}");
  pFVar1 = (this->super_ImmutableMessageFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_1b8,local_1c8,pFVar1,local_1d0);
  return;
}

Assistant:

void ImmutableMessageOneofFieldGenerator::GenerateMembers(
    io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $has_oneof_case_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "     return ($type$) $oneof_name$_;\n"
                 "  }\n"
                 "  return $type$.getDefaultInstance();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$OrBuilder "
                 "${$get$capitalized_name$OrBuilder$}$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "     return ($type$) $oneof_name$_;\n"
                 "  }\n"
                 "  return $type$.getDefaultInstance();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
}